

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  undefined1 *puVar1;
  IfcElement *this_00;
  long *plVar2;
  undefined1 *puVar3;
  
  this_00 = (IfcElement *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  plVar2 = (long *)((this->ConstructionType).ptr.field_2._M_local_buf +
                   *(long *)(*(long *)this + -0x18));
  plVar2[-0x31] = 0x8966f8;
  plVar2[3] = 0x896810;
  plVar2[-0x20] = 0x896720;
  plVar2[-0x1e] = 0x896748;
  plVar2[-0x17] = 0x896770;
  plVar2[-0x11] = 0x896798;
  plVar2[-10] = 0x8967c0;
  plVar2[-8] = 0x8967e8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  puVar3 = *(undefined1 **)&this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x18;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__00896830);
  operator_delete(this_00,0x1b8);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}